

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxPlusSolverForBGs.cpp
# Opt level: O0

void __thiscall
MaxPlusSolverForBGs::MaxPlusSolverForBGs
          (MaxPlusSolverForBGs *this,size_t maxiter,string *updateType,int verbosity,double damping,
          size_t nrSolutions,size_t nrRestarts)

{
  string *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  string *this_00;
  int in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  MaxPlusSolver *in_stack_ffffffffffffffb0;
  
  this_00 = (string *)&stack0xffffffffffffffa8;
  std::__cxx11::string::string(this_00,in_RDX);
  MaxPlusSolver::MaxPlusSolver
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,(double)this_00,in_RSI,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

MaxPlusSolverForBGs::MaxPlusSolverForBGs(
        size_t maxiter,
        string updateType,
        int verbosity,
        double damping,
        size_t nrSolutions,
        size_t nrRestarts)
    :
    MaxPlusSolver(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
{
}